

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  int extraout_EAX;
  ParamList *this_00;
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  *this_01;
  pointer expr;
  CallableSym *pCVar2;
  IRBuiltinFunction *callee_00;
  IRBuiltinHandler *callee_01;
  Instr *pIVar3;
  HandlerSym *handlerSym;
  undefined4 in_register_00000034;
  Value *callee_1;
  string local_98;
  IRBuiltinFunction *local_78;
  Value *callee;
  Value *local_68;
  Value *v;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *arg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  *__range2;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> args;
  CallExpr *call_local;
  IRGenerator *this_local;
  
  args.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(in_register_00000034,__fd);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&__range2);
  this_00 = CallExpr::args((CallExpr *)
                           args.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  this_01 = ParamList::values(this_00);
  __end2 = std::
           vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
           ::begin(this_01);
  arg = (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
        std::
        vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
        ::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_*,_std::vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>_>
                                *)&arg);
    if (!bVar1) {
      pCVar2 = CallExpr::callee((CallExpr *)
                                args.
                                super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = CallableSym::isFunction(pCVar2);
      if (bVar1) {
        pCVar2 = CallExpr::callee((CallExpr *)
                                  args.
                                  super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        callee_00 = (IRBuiltinFunction *)codegen(this,&pCVar2->super_Symbol);
        local_78 = callee_00;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"",(allocator<char> *)((long)&callee_1 + 7));
        pIVar3 = IRBuilder::createCallFunction
                           (&this->super_IRBuilder,callee_00,
                            (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&__range2,
                            &local_98);
        this->result_ = &pIVar3->super_Value;
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator((allocator<char> *)((long)&callee_1 + 7));
      }
      else {
        pCVar2 = CallExpr::callee((CallExpr *)
                                  args.
                                  super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = CallableSym::isBuiltin(pCVar2);
        if (bVar1) {
          pCVar2 = CallExpr::callee((CallExpr *)
                                    args.
                                    super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          callee_01 = (IRBuiltinHandler *)codegen(this,&pCVar2->super_Symbol);
          pIVar3 = IRBuilder::createInvokeHandler
                             (&this->super_IRBuilder,callee_01,
                              (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&__range2);
          this->result_ = &pIVar3->super_Value;
        }
        else {
          handlerSym = (HandlerSym *)
                       CallExpr::callee((CallExpr *)
                                        args.
                                        super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          codegenInline(this,handlerSym);
          this->result_ = (Value *)0x0;
        }
      }
      callee._4_4_ = 0;
LAB_00143a44:
      std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector
                ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&__range2);
      return extraout_EAX;
    }
    v = (Value *)__gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_*,_std::vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>_>
                 ::operator*(&__end2);
    expr = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get
                     ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)v);
    local_68 = codegen(this,expr);
    if (local_68 == (Value *)0x0) {
      callee._4_4_ = 1;
      goto LAB_00143a44;
    }
    std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::push_back
              ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&__range2,&local_68);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_*,_std::vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void IRGenerator::accept(CallExpr& call) {
  std::vector<Value*> args;
  for (const std::unique_ptr<Expr>& arg : call.args().values()) {
    if (Value* v = codegen(arg.get())) {
      args.push_back(v);
    } else {
      return;
    }
  }

  if (call.callee()->isFunction()) {
    Value* callee = codegen(call.callee());
    // builtin function
    result_ = createCallFunction(static_cast<IRBuiltinFunction*>(callee), args);
  } else if (call.callee()->isBuiltin()) {
    Value* callee = codegen(call.callee());
    // builtin handler
    result_ = createInvokeHandler(static_cast<IRBuiltinHandler*>(callee), args);
  } else {
    // source handler
    codegenInline(*static_cast<HandlerSym*>(call.callee()));
    result_ = nullptr;
  }
}